

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O0

QString * QLockFilePrivate::processNameByPid(qint64 pid)

{
  QByteArrayView bv;
  bool bVar1;
  undefined1 uVar2;
  undefined8 in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QByteArray buf;
  char exePath [64];
  DataPointer *in_stack_fffffffffffffed8;
  QFileSystemEntry *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QByteArrayView *this;
  FromNativePath FVar3;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff40;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = qt_haveLinuxProcfs();
  if (bVar1) {
    memset(local_48,0xaa,0x40);
    sprintf(local_48,"/proc/%lld/exe",in_RSI);
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    qt_readlink(in_stack_ffffffffffffff40);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x6ac8bc);
    if (bVar1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b0,(Data *)0x0,L"/ERROR/",7);
      QString::QString(&in_stack_fffffffffffffee0->m_filePath,in_stack_fffffffffffffed8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffee0);
    }
    else {
      QByteArrayView::QByteArrayView<11ul>
                (this,(char (*) [11])CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      FVar3 = SUB81((ulong)this >> 0x38,0);
      bv.m_data._0_4_ = in_stack_ffffffffffffff08;
      bv.m_size = in_stack_ffffffffffffff00;
      bv.m_data._4_4_ = in_stack_ffffffffffffff0c;
      uVar2 = QByteArray::endsWith
                        ((QByteArray *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
                         ,bv);
      if ((bool)uVar2) {
        QByteArray::chop((QByteArray *)in_stack_fffffffffffffee0,
                         (qsizetype)in_stack_fffffffffffffed8);
      }
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)CONCAT17(uVar2,in_stack_fffffffffffffee8),
                 (NativePath *)in_stack_fffffffffffffee0,FVar3);
      QFileSystemEntry::fileName((QFileSystemEntry *)CONCAT17(uVar2,in_stack_fffffffffffffee8));
      QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffee0);
    }
    QByteArray::~QByteArray((QByteArray *)0x6aca1b);
  }
  else {
    QString::QString((QString *)0x6ac836);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QLockFilePrivate::processNameByPid(qint64 pid)
{
#if defined(Q_OS_MACOS)
    char name[1024];
    proc_name(pid, name, sizeof(name) / sizeof(char));
    return QFile::decodeName(name);
#elif defined(Q_OS_LINUX)
    if (!qt_haveLinuxProcfs())
        return QString();

    char exePath[64];
    sprintf(exePath, "/proc/%lld/exe", pid);

    QByteArray buf = qt_readlink(exePath);
    if (buf.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }

    // remove the " (deleted)" suffix, if any
    static const char deleted[] = " (deleted)";
    if (buf.endsWith(deleted))
        buf.chop(strlen(deleted));

    return QFileSystemEntry(buf, QFileSystemEntry::FromNativePath()).fileName();
#elif defined(Q_OS_HAIKU)
    thread_info info;
    if (get_thread_info(pid, &info) != B_OK)
        return QString();
    return QFile::decodeName(info.name);
#elif defined(Q_OS_BSD4) && !defined(QT_PLATFORM_UIKIT)
# if defined(Q_OS_NETBSD)
    struct kinfo_proc2 kp;
    int mib[6] = { CTL_KERN, KERN_PROC2, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc2), 1 };
# elif defined(Q_OS_OPENBSD)
    struct kinfo_proc kp;
    int mib[6] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc), 1 };
# else
    struct kinfo_proc kp;
    int mib[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid };
# endif
    size_t len = sizeof(kp);
    u_int mib_len = sizeof(mib)/sizeof(u_int);

    if (sysctl(mib, mib_len, &kp, &len, NULL, 0) < 0)
        return QString();

# if defined(Q_OS_OPENBSD) || defined(Q_OS_NETBSD)
    if (kp.p_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.p_comm);
# else
    if (kp.ki_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.ki_comm);
# endif
    return name;
#elif defined(Q_OS_QNX)
    char exePath[PATH_MAX];
    sprintf(exePath, "/proc/%lld/exefile", pid);

    int fd = qt_safe_open(exePath, O_RDONLY);
    if (fd == -1)
        return QString();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QString();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size - 1));
    if (buffer.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }
    return QFileSystemEntry(buffer, QFileSystemEntry::FromNativePath()).fileName();
#else
    Q_UNUSED(pid);
    return QString();
#endif
}